

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::Board(Board *this,Board *board)

{
  string *psVar1;
  string *psVar2;
  vector<Block,_std::allocator<Block>_> *this_00;
  Board *pBVar3;
  int j;
  long lVar4;
  int i;
  long lVar5;
  
  memset(this,0,0x90);
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  (this->identifier)._M_string_length = 0;
  psVar1 = &this->identifier;
  (this->identifier).field_2._M_local_buf[0] = '\0';
  psVar2 = &this->referrer;
  (this->referrer)._M_dataplus._M_p = (pointer)&(this->referrer).field_2;
  (this->referrer)._M_string_length = 0;
  (this->referrer).field_2._M_local_buf[0] = '\0';
  this_00 = &this->blocks;
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar3 = board;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      this->cells[0][lVar4] = pBVar3->cells[0][lVar4];
    }
    pBVar3 = (Board *)(pBVar3->cells + 1);
    this = (Board *)(this->cells + 1);
  }
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::_M_assign((string *)psVar2);
  std::vector<Block,_std::allocator<Block>_>::operator=(this_00,&board->blocks);
  return;
}

Assistant:

Board::Board(const Board &board) {

    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            this->cells[i][j] = board.cells[i][j];
        }
    }
    this->identifier = board.identifier;
    this->referrer = board.referrer;
    this->blocks = board.blocks;
}